

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void f_outer(uint64_t *h,uint8_t *blk,uint64_t offset_hi,uint64_t offset_lo,uint final)

{
  uint64_t uVar1;
  uint local_bc;
  uint i;
  uint64_t m [16];
  uint final_local;
  uint64_t offset_lo_local;
  uint64_t offset_hi_local;
  uint8_t *blk_local;
  uint64_t *h_local;
  
  for (local_bc = 0; local_bc < 0x10; local_bc = local_bc + 1) {
    uVar1 = GET_64BIT_LSB_FIRST(blk + (local_bc << 3));
    *(uint64_t *)(&stack0xffffffffffffff48 + (ulong)local_bc * 8) = uVar1;
  }
  f(h,(uint64_t *)&stack0xffffffffffffff48,offset_hi,offset_lo,final);
  smemclr(&stack0xffffffffffffff48,0x80);
  return;
}

Assistant:

static inline void f_outer(uint64_t h[8], uint8_t blk[128], uint64_t offset_hi,
                           uint64_t offset_lo, unsigned final)
{
    uint64_t m[16];
    for (unsigned i = 0; i < 16; i++)
        m[i] = GET_64BIT_LSB_FIRST(blk + 8*i);
    f(h, m, offset_hi, offset_lo, final);
    smemclr(m, sizeof(m));
}